

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_bucket.c
# Opt level: O2

int bucket_remove(bucket b,comparable_callback compare_cb,void *key,void **value)

{
  pair ppVar1;
  void *pvVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  undefined8 uVar6;
  char *pcVar7;
  ulong new_capacity;
  long lVar8;
  
  if ((compare_cb == (comparable_callback)0x0 || b == (bucket)0x0) || key == (void *)0x0) {
    pcVar7 = "Invalid bucket remove parameters";
    uVar6 = 0x115;
  }
  else if ((b->pairs == (pair)0x0) || (uVar4 = b->count, uVar4 == 0)) {
    pcVar7 = "Invalid bucket remove pairs";
    uVar6 = 0x11b;
  }
  else {
    lVar8 = 0;
    uVar5 = 0;
    while( true ) {
      if (uVar4 <= uVar5) {
        return 1;
      }
      ppVar1 = b->pairs;
      iVar3 = (*compare_cb)(key,*(comparable *)((long)&ppVar1->key + lVar8));
      if (iVar3 == 0) break;
      uVar5 = uVar5 + 1;
      uVar4 = b->count;
      lVar8 = lVar8 + 0x10;
    }
    pvVar2 = *(void **)((long)&ppVar1->value + lVar8);
    uVar4 = b->capacity;
    new_capacity = uVar4 >> 1;
    memmove((void *)((long)&ppVar1->key + lVar8),(void *)((long)&b->pairs[1].key + lVar8),
            (b->count - uVar5) * 0x10 - 0x10);
    uVar5 = b->count - 1;
    b->count = uVar5;
    if ((uVar4 < 10 || new_capacity < uVar5) ||
       (iVar3 = bucket_realloc_pairs(b,new_capacity), iVar3 == 0)) {
      if (value != (void **)0x0) {
        *value = pvVar2;
        return 0;
      }
      return 0;
    }
    pcVar7 = "Invalid bucket remove pairs reallocation";
    uVar6 = 0x133;
  }
  log_write_impl_va("metacall",uVar6,"bucket_remove",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_bucket.c"
                    ,3,pcVar7);
  return 1;
}

Assistant:

int bucket_remove(bucket b, comparable_callback compare_cb, void *key, void **value)
{
	size_t iterator;

	if (b == NULL || compare_cb == NULL || key == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid bucket remove parameters");
		return 1;
	}

	if (b->pairs == NULL || b->count == 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid bucket remove pairs");
		return 1;
	}

	for (iterator = 0; iterator < b->count; ++iterator)
	{
		pair p = &b->pairs[iterator];

		if (compare_cb(key, p->key) == 0)
		{
			void *deleted_value = p->value;

			size_t next = iterator + 1;

			size_t new_capacity = b->capacity >> 1;

			memmove(p, &b->pairs[next], sizeof(struct pair_type) * (b->count - next));

			--b->count;

			if (b->count <= new_capacity && new_capacity > BUCKET_PAIRS_DEFAULT)
			{
				if (bucket_realloc_pairs(b, new_capacity) != 0)
				{
					log_write("metacall", LOG_LEVEL_ERROR, "Invalid bucket remove pairs reallocation");
					return 1;
				}
			}

			if (value != NULL)
			{
				*value = deleted_value;
			}

			return 0;
		}
	}

	return 1;
}